

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

void golf_string_initf(golf_string_t *str,char *alloc_category,char *format,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_3c;
  undefined4 local_38;
  int len;
  va_list args;
  char *format_local;
  char *alloc_category_local;
  golf_string_t *str_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  len = 0x30;
  local_38 = 0x18;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  args[0]._0_8_ = &stack0x00000008;
  args[0].overflow_arg_area = local_f8;
  args[0].reg_save_area = format;
  local_3c = vsnprintf((char *)0x0,0,format,&local_38);
  str->cap = local_3c;
  str->len = local_3c;
  str->alloc_category = alloc_category;
  pcVar1 = (char *)golf_alloc_tracked((long)(str->cap + 1),str->alloc_category);
  str->cstr = pcVar1;
  len = 0x30;
  local_38 = 0x18;
  args[0]._0_8_ = &stack0x00000008;
  args[0].overflow_arg_area = local_f8;
  vsprintf(str->cstr,(char *)args[0].reg_save_area,&local_38);
  return;
}

Assistant:

void golf_string_initf(golf_string_t *str, const char *alloc_category, const char *format, ...) {
    va_list args; 
    va_start(args, format); 
    int len = vsnprintf(NULL, 0, format, args);
    va_end(args);

    str->cap = len;
    str->len = len;
    str->alloc_category = alloc_category;
    str->cstr = golf_alloc_tracked(sizeof(char)*(str->cap + 1), str->alloc_category);

    va_start(args, format); 
    vsprintf(str->cstr, format, args);
    va_end(args);
}